

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O1

aom_codec_err_t
av1_check_initial_width(AV1_COMP *cpi,int use_highbitdepth,int subsampling_x,int subsampling_y)

{
  SequenceHeader *pSVar1;
  RefCntBuffer *pRVar2;
  int *piVar3;
  _Bool _Var4;
  long lVar5;
  
  pSVar1 = (cpi->common).seq_params;
  if ((((cpi->frame_size_related_setup_done != true) ||
       ((uint)pSVar1->use_highbitdepth != use_highbitdepth)) ||
      (pSVar1->subsampling_x != subsampling_x)) || (pSVar1->subsampling_y != subsampling_y)) {
    pSVar1->subsampling_x = subsampling_x;
    pSVar1->subsampling_y = subsampling_y;
    pSVar1->use_highbitdepth = (uint8_t)use_highbitdepth;
    av1_set_speed_features_framesize_independent(cpi,(cpi->oxcf).speed);
    av1_set_speed_features_framesize_dependent(cpi,(cpi->oxcf).speed);
    if ((((cpi->oxcf).pass != AOM_RC_FIRST_PASS) && (cpi->compressor_stage != '\x01')) &&
       (_Var4 = av1_tf_info_alloc(&cpi->ppi->tf_info,cpi), !_Var4)) {
      return AOM_CODEC_MEM_ERROR;
    }
    pRVar2 = (cpi->common).cur_frame;
    if (pRVar2 != (RefCntBuffer *)0x0) {
      pRVar2->ref_count = pRVar2->ref_count + -1;
      (cpi->common).cur_frame = (RefCntBuffer *)0x0;
    }
    lVar5 = 0x7824;
    do {
      piVar3 = *(int **)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar5 * 8);
      if (piVar3 != (int *)0x0) {
        *piVar3 = *piVar3 + -1;
        *(undefined8 *)((long)((cpi->enc_quant_dequant_params).quants.y_quant + -1) + lVar5 * 8) = 0
        ;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x782c);
    init_motion_estimation(cpi);
    cpi->initial_mbs = (cpi->common).mi_params.MBs;
    cpi->frame_size_related_setup_done = true;
  }
  return AOM_CODEC_OK;
}

Assistant:

aom_codec_err_t av1_check_initial_width(AV1_COMP *cpi, int use_highbitdepth,
                                        int subsampling_x, int subsampling_y) {
  AV1_COMMON *const cm = &cpi->common;
  SequenceHeader *const seq_params = cm->seq_params;

  if (!cpi->frame_size_related_setup_done ||
      seq_params->use_highbitdepth != use_highbitdepth ||
      seq_params->subsampling_x != subsampling_x ||
      seq_params->subsampling_y != subsampling_y) {
    seq_params->subsampling_x = subsampling_x;
    seq_params->subsampling_y = subsampling_y;
    seq_params->use_highbitdepth = use_highbitdepth;

    av1_set_speed_features_framesize_independent(cpi, cpi->oxcf.speed);
    av1_set_speed_features_framesize_dependent(cpi, cpi->oxcf.speed);

    if (!is_stat_generation_stage(cpi)) {
#if !CONFIG_REALTIME_ONLY
      if (!av1_tf_info_alloc(&cpi->ppi->tf_info, cpi))
        return AOM_CODEC_MEM_ERROR;
#endif  // !CONFIG_REALTIME_ONLY
    }
    init_ref_frame_bufs(cpi);

    init_motion_estimation(cpi);  // TODO(agrange) This can be removed.

    cpi->initial_mbs = cm->mi_params.MBs;
    cpi->frame_size_related_setup_done = true;
  }
  return AOM_CODEC_OK;
}